

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

int __thiscall
gl3cts::TransformFeedbackOverflowQueryBaseTest::init
          (TransformFeedbackOverflowQueryBaseTest *this,EVP_PKEY_CTX *ctx)

{
  ContextInfo *pCVar1;
  bool bVar2;
  GLuint GVar3;
  undefined7 extraout_var;
  NotSupportedError *this_00;
  string local_40;
  
  if (this->m_api == API_GL_ARB_transform_feedback_overflow_query) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_ARB_transform_feedback_overflow_query");
    if (bVar2) {
      bVar2 = supportsTransformFeedback3(this);
      GVar3 = (GLuint)CONCAT71(extraout_var,bVar2);
      if (bVar2) {
        pCVar1 = ((this->super_TestCase).m_context)->m_contextInfo;
        GVar3 = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,0x8e71);
        this->m_max_vertex_streams = GVar3;
      }
      return GVar3;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Required transform_feedback_overflow_query extension is not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool featureSupported()
	{
		return (m_api == TransformFeedbackOverflowQueryTests::API_GL_ARB_transform_feedback_overflow_query &&
				m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback_overflow_query"));
	}